

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parallelepiped.cpp
# Opt level: O1

void __thiscall Parallelepiped::_calculateTriangles(Parallelepiped *this)

{
  mat4 *ltw;
  vector<Triangle_*,_std::allocator<Triangle_*>_> *this_00;
  Triangle *pTVar1;
  Triangle *local_1d8;
  anon_union_12_3_e2189aaa_for_tvec3<float>_1 local_1d0;
  anon_union_12_3_e2189aaa_for_tvec3<float>_1 local_1c4;
  anon_union_12_3_e2189aaa_for_tvec3<float>_1 local_1b8;
  anon_union_12_3_e2189aaa_for_tvec3<float>_1 local_1ac;
  anon_union_12_3_e2189aaa_for_tvec3<float>_1 local_1a0;
  anon_union_12_3_e2189aaa_for_tvec3<float>_1 local_194;
  anon_union_12_3_e2189aaa_for_tvec3<float>_1 local_188;
  anon_union_12_3_e2189aaa_for_tvec3<float>_1 local_17c;
  anon_union_12_3_e2189aaa_for_tvec3<float>_1 local_170;
  anon_union_12_3_e2189aaa_for_tvec3<float>_1 local_164;
  anon_union_12_3_e2189aaa_for_tvec3<float>_1 local_158;
  anon_union_12_3_e2189aaa_for_tvec3<float>_1 local_14c;
  anon_union_12_3_e2189aaa_for_tvec3<float>_1 local_140;
  anon_union_12_3_e2189aaa_for_tvec3<float>_1 local_134;
  anon_union_12_3_e2189aaa_for_tvec3<float>_1 local_128;
  anon_union_12_3_e2189aaa_for_tvec3<float>_1 local_11c;
  anon_union_12_3_e2189aaa_for_tvec3<float>_1 local_110;
  anon_union_12_3_e2189aaa_for_tvec3<float>_1 local_104;
  anon_union_12_3_e2189aaa_for_tvec3<float>_1 local_f8;
  anon_union_12_3_e2189aaa_for_tvec3<float>_1 local_ec;
  anon_union_12_3_e2189aaa_for_tvec3<float>_1 local_e0;
  anon_union_12_3_e2189aaa_for_tvec3<float>_1 local_d4;
  anon_union_12_3_e2189aaa_for_tvec3<float>_1 local_c8;
  anon_union_12_3_e2189aaa_for_tvec3<float>_1 local_bc;
  anon_union_12_3_e2189aaa_for_tvec3<float>_1 local_b0;
  anon_union_12_3_e2189aaa_for_tvec3<float>_1 local_a4;
  anon_union_12_3_e2189aaa_for_tvec3<float>_1 local_98;
  anon_union_12_3_e2189aaa_for_tvec3<float>_1 local_8c;
  anon_union_12_3_e2189aaa_for_tvec3<float>_1 local_80;
  anon_union_12_3_e2189aaa_for_tvec3<float>_1 local_74;
  anon_union_12_3_e2189aaa_for_tvec3<float>_1 local_68;
  anon_union_12_3_e2189aaa_for_tvec3<float>_1 local_5c;
  anon_union_12_3_e2189aaa_for_tvec3<float>_1 local_50;
  anon_union_12_3_e2189aaa_for_tvec3<float>_1 local_44;
  anon_union_12_3_e2189aaa_for_tvec3<float>_1 local_38;
  anon_union_12_3_e2189aaa_for_tvec3<float>_1 local_2c;
  
  pTVar1 = (Triangle *)operator_new(0x60);
  ltw = &(this->super_SceneObject).localToWorld;
  local_2c.field_0.x = (this->v0).field_0.field_0.x;
  local_2c.field_0.y = (this->v0).field_0.field_0.y;
  local_2c.field_0.z = (this->v0).field_0.field_0.z;
  local_38.field_0.x = (this->v1).field_0.field_0.x;
  local_38.field_0.y = (this->v1).field_0.field_0.y;
  local_38.field_0.z = (this->v1).field_0.field_0.z;
  local_44.field_0.x = (this->v2).field_0.field_0.x;
  local_44.field_0.y = (this->v2).field_0.field_0.y;
  local_44.field_0.z = (this->v2).field_0.field_0.z;
  Triangle::Triangle(pTVar1,ltw,(vec3 *)&local_2c.field_0,(vec3 *)&local_38.field_0,
                     (vec3 *)&local_44.field_0,(this->super_SceneObject).color);
  this_00 = &this->triangles;
  local_1d8 = pTVar1;
  std::vector<Triangle*,std::allocator<Triangle*>>::emplace_back<Triangle*>
            ((vector<Triangle*,std::allocator<Triangle*>> *)this_00,&local_1d8);
  pTVar1 = (Triangle *)operator_new(0x60);
  local_50.field_0.x = (this->v1).field_0.field_0.x;
  local_50.field_0.y = (this->v1).field_0.field_0.y;
  local_50.field_0.z = (this->v1).field_0.field_0.z;
  local_5c.field_0.x = (this->v3).field_0.field_0.x;
  local_5c.field_0.y = (this->v3).field_0.field_0.y;
  local_5c.field_0.z = (this->v3).field_0.field_0.z;
  local_68.field_0.x = (this->v2).field_0.field_0.x;
  local_68.field_0.y = (this->v2).field_0.field_0.y;
  local_68.field_0.z = (this->v2).field_0.field_0.z;
  Triangle::Triangle(pTVar1,ltw,(vec3 *)&local_50.field_0,(vec3 *)&local_5c.field_0,
                     (vec3 *)&local_68.field_0,(this->super_SceneObject).color);
  local_1d8 = pTVar1;
  std::vector<Triangle*,std::allocator<Triangle*>>::emplace_back<Triangle*>
            ((vector<Triangle*,std::allocator<Triangle*>> *)this_00,&local_1d8);
  pTVar1 = (Triangle *)operator_new(0x60);
  local_74.field_0.x = (this->v0).field_0.field_0.x;
  local_74.field_0.y = (this->v0).field_0.field_0.y;
  local_74.field_0.z = (this->v0).field_0.field_0.z;
  local_80.field_0.x = (this->v4).field_0.field_0.x;
  local_80.field_0.y = (this->v4).field_0.field_0.y;
  local_80.field_0.z = (this->v4).field_0.field_0.z;
  local_8c.field_0.x = (this->v1).field_0.field_0.x;
  local_8c.field_0.y = (this->v1).field_0.field_0.y;
  local_8c.field_0.z = (this->v1).field_0.field_0.z;
  Triangle::Triangle(pTVar1,ltw,(vec3 *)&local_74.field_0,(vec3 *)&local_80.field_0,
                     (vec3 *)&local_8c.field_0,(this->super_SceneObject).color);
  local_1d8 = pTVar1;
  std::vector<Triangle*,std::allocator<Triangle*>>::emplace_back<Triangle*>
            ((vector<Triangle*,std::allocator<Triangle*>> *)this_00,&local_1d8);
  pTVar1 = (Triangle *)operator_new(0x60);
  local_98.field_0.x = (this->v1).field_0.field_0.x;
  local_98.field_0.y = (this->v1).field_0.field_0.y;
  local_98.field_0.z = (this->v1).field_0.field_0.z;
  local_a4.field_0.x = (this->v4).field_0.field_0.x;
  local_a4.field_0.y = (this->v4).field_0.field_0.y;
  local_a4.field_0.z = (this->v4).field_0.field_0.z;
  local_b0.field_0.x = (this->v5).field_0.field_0.x;
  local_b0.field_0.y = (this->v5).field_0.field_0.y;
  local_b0.field_0.z = (this->v5).field_0.field_0.z;
  Triangle::Triangle(pTVar1,ltw,(vec3 *)&local_98.field_0,(vec3 *)&local_a4.field_0,
                     (vec3 *)&local_b0.field_0,(this->super_SceneObject).color);
  local_1d8 = pTVar1;
  std::vector<Triangle*,std::allocator<Triangle*>>::emplace_back<Triangle*>
            ((vector<Triangle*,std::allocator<Triangle*>> *)this_00,&local_1d8);
  pTVar1 = (Triangle *)operator_new(0x60);
  local_bc.field_0.x = (this->v0).field_0.field_0.x;
  local_bc.field_0.y = (this->v0).field_0.field_0.y;
  local_bc.field_0.z = (this->v0).field_0.field_0.z;
  local_c8.field_0.x = (this->v2).field_0.field_0.x;
  local_c8.field_0.y = (this->v2).field_0.field_0.y;
  local_c8.field_0.z = (this->v2).field_0.field_0.z;
  local_d4.field_0.x = (this->v4).field_0.field_0.x;
  local_d4.field_0.y = (this->v4).field_0.field_0.y;
  local_d4.field_0.z = (this->v4).field_0.field_0.z;
  Triangle::Triangle(pTVar1,ltw,(vec3 *)&local_bc.field_0,(vec3 *)&local_c8.field_0,
                     (vec3 *)&local_d4.field_0,(this->super_SceneObject).color);
  local_1d8 = pTVar1;
  std::vector<Triangle*,std::allocator<Triangle*>>::emplace_back<Triangle*>
            ((vector<Triangle*,std::allocator<Triangle*>> *)this_00,&local_1d8);
  pTVar1 = (Triangle *)operator_new(0x60);
  local_e0.field_0.x = (this->v2).field_0.field_0.x;
  local_e0.field_0.y = (this->v2).field_0.field_0.y;
  local_e0.field_0.z = (this->v2).field_0.field_0.z;
  local_ec.field_0.x = (this->v6).field_0.field_0.x;
  local_ec.field_0.y = (this->v6).field_0.field_0.y;
  local_ec.field_0.z = (this->v6).field_0.field_0.z;
  local_f8.field_0.x = (this->v4).field_0.field_0.x;
  local_f8.field_0.y = (this->v4).field_0.field_0.y;
  local_f8.field_0.z = (this->v4).field_0.field_0.z;
  Triangle::Triangle(pTVar1,ltw,(vec3 *)&local_e0.field_0,(vec3 *)&local_ec.field_0,
                     (vec3 *)&local_f8.field_0,(this->super_SceneObject).color);
  local_1d8 = pTVar1;
  std::vector<Triangle*,std::allocator<Triangle*>>::emplace_back<Triangle*>
            ((vector<Triangle*,std::allocator<Triangle*>> *)this_00,&local_1d8);
  pTVar1 = (Triangle *)operator_new(0x60);
  local_104.field_0.x = (this->v1).field_0.field_0.x;
  local_104.field_0.y = (this->v1).field_0.field_0.y;
  local_104.field_0.z = (this->v1).field_0.field_0.z;
  local_110.field_0.x = (this->v5).field_0.field_0.x;
  local_110.field_0.y = (this->v5).field_0.field_0.y;
  local_110.field_0.z = (this->v5).field_0.field_0.z;
  local_11c.field_0.x = (this->v3).field_0.field_0.x;
  local_11c.field_0.y = (this->v3).field_0.field_0.y;
  local_11c.field_0.z = (this->v3).field_0.field_0.z;
  Triangle::Triangle(pTVar1,ltw,(vec3 *)&local_104.field_0,(vec3 *)&local_110.field_0,
                     (vec3 *)&local_11c.field_0,(this->super_SceneObject).color);
  local_1d8 = pTVar1;
  std::vector<Triangle*,std::allocator<Triangle*>>::emplace_back<Triangle*>
            ((vector<Triangle*,std::allocator<Triangle*>> *)this_00,&local_1d8);
  pTVar1 = (Triangle *)operator_new(0x60);
  local_128.field_0.x = (this->v3).field_0.field_0.x;
  local_128.field_0.y = (this->v3).field_0.field_0.y;
  local_128.field_0.z = (this->v3).field_0.field_0.z;
  local_134.field_0.x = (this->v5).field_0.field_0.x;
  local_134.field_0.y = (this->v5).field_0.field_0.y;
  local_134.field_0.z = (this->v5).field_0.field_0.z;
  local_140.field_0.x = (this->v7).field_0.field_0.x;
  local_140.field_0.y = (this->v7).field_0.field_0.y;
  local_140.field_0.z = (this->v7).field_0.field_0.z;
  Triangle::Triangle(pTVar1,ltw,(vec3 *)&local_128.field_0,(vec3 *)&local_134.field_0,
                     (vec3 *)&local_140.field_0,(this->super_SceneObject).color);
  local_1d8 = pTVar1;
  std::vector<Triangle*,std::allocator<Triangle*>>::emplace_back<Triangle*>
            ((vector<Triangle*,std::allocator<Triangle*>> *)this_00,&local_1d8);
  pTVar1 = (Triangle *)operator_new(0x60);
  local_14c.field_0.x = (this->v2).field_0.field_0.x;
  local_14c.field_0.y = (this->v2).field_0.field_0.y;
  local_14c.field_0.z = (this->v2).field_0.field_0.z;
  local_158.field_0.x = (this->v3).field_0.field_0.x;
  local_158.field_0.y = (this->v3).field_0.field_0.y;
  local_158.field_0.z = (this->v3).field_0.field_0.z;
  local_164.field_0.x = (this->v6).field_0.field_0.x;
  local_164.field_0.y = (this->v6).field_0.field_0.y;
  local_164.field_0.z = (this->v6).field_0.field_0.z;
  Triangle::Triangle(pTVar1,ltw,(vec3 *)&local_14c.field_0,(vec3 *)&local_158.field_0,
                     (vec3 *)&local_164.field_0,(this->super_SceneObject).color);
  local_1d8 = pTVar1;
  std::vector<Triangle*,std::allocator<Triangle*>>::emplace_back<Triangle*>
            ((vector<Triangle*,std::allocator<Triangle*>> *)this_00,&local_1d8);
  pTVar1 = (Triangle *)operator_new(0x60);
  local_170.field_0.x = (this->v3).field_0.field_0.x;
  local_170.field_0.y = (this->v3).field_0.field_0.y;
  local_170.field_0.z = (this->v3).field_0.field_0.z;
  local_17c.field_0.x = (this->v7).field_0.field_0.x;
  local_17c.field_0.y = (this->v7).field_0.field_0.y;
  local_17c.field_0.z = (this->v7).field_0.field_0.z;
  local_188.field_0.x = (this->v6).field_0.field_0.x;
  local_188.field_0.y = (this->v6).field_0.field_0.y;
  local_188.field_0.z = (this->v6).field_0.field_0.z;
  Triangle::Triangle(pTVar1,ltw,(vec3 *)&local_170.field_0,(vec3 *)&local_17c.field_0,
                     (vec3 *)&local_188.field_0,(this->super_SceneObject).color);
  local_1d8 = pTVar1;
  std::vector<Triangle*,std::allocator<Triangle*>>::emplace_back<Triangle*>
            ((vector<Triangle*,std::allocator<Triangle*>> *)this_00,&local_1d8);
  pTVar1 = (Triangle *)operator_new(0x60);
  local_194.field_0.x = (this->v4).field_0.field_0.x;
  local_194.field_0.y = (this->v4).field_0.field_0.y;
  local_194.field_0.z = (this->v4).field_0.field_0.z;
  local_1a0.field_0.x = (this->v6).field_0.field_0.x;
  local_1a0.field_0.y = (this->v6).field_0.field_0.y;
  local_1a0.field_0.z = (this->v6).field_0.field_0.z;
  local_1ac.field_0.x = (this->v5).field_0.field_0.x;
  local_1ac.field_0.y = (this->v5).field_0.field_0.y;
  local_1ac.field_0.z = (this->v5).field_0.field_0.z;
  Triangle::Triangle(pTVar1,ltw,(vec3 *)&local_194.field_0,(vec3 *)&local_1a0.field_0,
                     (vec3 *)&local_1ac.field_0,(this->super_SceneObject).color);
  local_1d8 = pTVar1;
  std::vector<Triangle*,std::allocator<Triangle*>>::emplace_back<Triangle*>
            ((vector<Triangle*,std::allocator<Triangle*>> *)this_00,&local_1d8);
  pTVar1 = (Triangle *)operator_new(0x60);
  local_1b8.field_0.x = (this->v5).field_0.field_0.x;
  local_1b8.field_0.y = (this->v5).field_0.field_0.y;
  local_1b8.field_0.z = (this->v5).field_0.field_0.z;
  local_1c4.field_0.x = (this->v6).field_0.field_0.x;
  local_1c4.field_0.y = (this->v6).field_0.field_0.y;
  local_1c4.field_0.z = (this->v6).field_0.field_0.z;
  local_1d0.field_0.x = (this->v7).field_0.field_0.x;
  local_1d0.field_0.y = (this->v7).field_0.field_0.y;
  local_1d0.field_0.z = (this->v7).field_0.field_0.z;
  Triangle::Triangle(pTVar1,ltw,(vec3 *)&local_1b8.field_0,(vec3 *)&local_1c4.field_0,
                     (vec3 *)&local_1d0.field_0,(this->super_SceneObject).color);
  local_1d8 = pTVar1;
  std::vector<Triangle*,std::allocator<Triangle*>>::emplace_back<Triangle*>
            ((vector<Triangle*,std::allocator<Triangle*>> *)this_00,&local_1d8);
  return;
}

Assistant:

void Parallelepiped::_calculateTriangles() {
    //front
    triangles.push_back(new Triangle(localToWorld, v0, v1, v2, color));
    triangles.push_back(new Triangle(localToWorld, v1, v3, v2, color));
    
    //bottom
    triangles.push_back(new Triangle(localToWorld, v0, v4, v1, color));
    triangles.push_back(new Triangle(localToWorld, v1, v4, v5, color));
    
    //left
    triangles.push_back(new Triangle(localToWorld, v0, v2, v4, color));
    triangles.push_back(new Triangle(localToWorld, v2, v6, v4, color));
    
    //right
    triangles.push_back(new Triangle(localToWorld, v1, v5, v3, color));
    triangles.push_back(new Triangle(localToWorld, v3, v5, v7, color));
    
    //top
    triangles.push_back(new Triangle(localToWorld, v2, v3, v6, color));
    triangles.push_back(new Triangle(localToWorld, v3, v7, v6, color));
    
    //back
    triangles.push_back(new Triangle(localToWorld, v4, v6, v5, color));
    triangles.push_back(new Triangle(localToWorld, v5, v6, v7, color));
}